

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChParserOpenSim::Parse(ChParserOpenSim *this,ChSystem *system,string *filename)

{
  double *pdVar1;
  pointer psVar2;
  pointer *ppcVar3;
  double dVar4;
  double dVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  xml_node<char> *pxVar9;
  xml_node<char> *pxVar10;
  ostream *poVar11;
  ChLoadContainer *pCVar12;
  long *plVar13;
  char *pcVar14;
  pointer psVar15;
  undefined8 uVar16;
  shared_ptr<chrono::ChLoadContainer> loadcontainer;
  vector<double,_std::allocator<double>_> elems;
  file<char> file;
  path filepath;
  xml_document<char> doc;
  ChLoadContainer *pCStack_101a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_101a0;
  undefined1 auStack_10198 [24];
  undefined1 auStack_10180 [24];
  file<char> fStack_10168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10150;
  string sStack_10148;
  shared_ptr<chrono::ChLoadContainer> sStack_10128;
  shared_ptr<chrono::ChPhysicsItem> sStack_10118;
  string sStack_10100;
  path pStack_100e0;
  undefined1 auStack_100b8 [32];
  xml_node<char> *pxStack_10098;
  node_type nStack_10090;
  xml_node<char> *pxStack_10088;
  xml_attribute<char> *pxStack_10078;
  memory_pool<char> mStack_10058;
  
  filesystem::path::path(&pStack_100e0,filename);
  filesystem::path::parent_path((path *)auStack_100b8,&pStack_100e0);
  filesystem::path::str_abi_cxx11_(&sStack_10100,(path *)auStack_100b8,native_path);
  plVar7 = (long *)std::__cxx11::string::append((char *)&sStack_10100);
  pCVar12 = (ChLoadContainer *)(plVar7 + 2);
  if ((ChLoadContainer *)*plVar7 == pCVar12) {
    auStack_10198._0_8_ = (pCVar12->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    auStack_10198._8_8_ = plVar7[3];
    pCStack_101a8 = (ChLoadContainer *)auStack_10198;
  }
  else {
    auStack_10198._0_8_ = (pCVar12->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    pCStack_101a8 = (ChLoadContainer *)*plVar7;
  }
  _Stack_101a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
  *plVar7 = (long)pCVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  filesystem::path::stem_abi_cxx11_(&sStack_10148,&pStack_100e0);
  psVar2 = (pointer)((long)&(_Stack_101a0._M_pi)->_vptr__Sp_counted_base +
                    sStack_10148._M_string_length);
  psVar15 = (pointer)0xf;
  if (pCStack_101a8 != (ChLoadContainer *)auStack_10198) {
    psVar15 = (pointer)auStack_10198._0_8_;
  }
  if (psVar15 < psVar2) {
    uVar16 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_10148._M_dataplus._M_p != &sStack_10148.field_2) {
      uVar16 = sStack_10148.field_2._M_allocated_capacity;
    }
    if (psVar2 <= (ulong)uVar16) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&sStack_10148,0,(char *)0x0,(ulong)pCStack_101a8);
      goto LAB_0092c053;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&pCStack_101a8,(ulong)sStack_10148._M_dataplus._M_p);
LAB_0092c053:
  auStack_10198._16_8_ = auStack_10180 + 8;
  pdVar1 = (double *)(puVar8 + 2);
  if ((double *)*puVar8 == pdVar1) {
    auStack_10180._8_8_ = *pdVar1;
    auStack_10180._16_8_ = puVar8[3];
  }
  else {
    auStack_10180._8_8_ = *pdVar1;
    auStack_10198._16_8_ = (double *)*puVar8;
  }
  auStack_10180._0_8_ = puVar8[1];
  *puVar8 = pdVar1;
  puVar8[1] = 0;
  *(undefined1 *)pdVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append(auStack_10198 + 0x10);
  ppcVar3 = &fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar13 = plVar7 + 2;
  if ((pointer *)*plVar7 == (pointer *)plVar13) {
    fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
    _Stack_10150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
    fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppcVar3;
  }
  else {
    fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
    fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar7;
  }
  fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_datapath,(string *)&fStack_10168);
  if ((pointer *)
      fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != ppcVar3) {
    operator_delete(fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(((shared_ptr<chrono::ChVisualModel> *)
                                    fStack_10168.m_data.
                                    super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage)->
                                   super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + 1));
  }
  if ((undefined1 *)auStack_10198._16_8_ != auStack_10180 + 8) {
    operator_delete((void *)auStack_10198._16_8_,auStack_10180._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10148._M_dataplus._M_p != &sStack_10148.field_2) {
    operator_delete(sStack_10148._M_dataplus._M_p,
                    (ulong)(sStack_10148.field_2._M_allocated_capacity + 1));
  }
  if (pCStack_101a8 != (ChLoadContainer *)auStack_10198) {
    operator_delete(pCStack_101a8,
                    (ulong)((long)&((__shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2> *)
                                   auStack_10198._0_8_)->_M_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10100._M_dataplus._M_p != &sStack_10100.field_2) {
    operator_delete(sStack_10100._M_dataplus._M_p,sStack_10100.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(auStack_100b8 + 8));
  rapidxml::file<char>::file(&fStack_10168,(filename->_M_dataplus)._M_p);
  mStack_10058.m_begin = mStack_10058.m_static_memory;
  pxStack_10098 = (xml_node<char> *)0x0;
  auStack_100b8._0_8_ = (char *)0x0;
  auStack_100b8._8_8_ = (pointer)0x0;
  nStack_10090 = node_document;
  pxStack_10088 = (xml_node<char> *)0x0;
  pxStack_10078 = (xml_attribute<char> *)0x0;
  mStack_10058.m_end = (char *)&mStack_10058.m_alloc_func;
  mStack_10058.m_alloc_func = (alloc_func *)0x0;
  mStack_10058.m_free_func = (free_func *)0x0;
  mStack_10058.m_ptr = mStack_10058.m_begin;
  rapidxml::xml_document<char>::parse<0>
            ((xml_document<char> *)auStack_100b8,
             fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  pxVar9 = rapidxml::xml_node<char>::first_node(pxStack_10088,"Model",0,true);
  pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"gravity",0,true);
  pcVar14 = (pxVar9->super_xml_base<char>).m_value;
  if (pcVar14 == (char *)0x0) {
    pcVar14 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  strToSTLVector<double>((vector<double,_std::allocator<double>_> *)(auStack_10198 + 0x10),pcVar14);
  dVar4 = *(double *)(auStack_10198._16_8_ + 0x10);
  dVar5 = *(double *)(auStack_10198._16_8_ + 8);
  (system->G_acc).m_data[0] = *(double *)auStack_10198._16_8_;
  (system->G_acc).m_data[1] = dVar5;
  (system->G_acc).m_data[2] = dVar4;
  pxVar9 = rapidxml::xml_node<char>::first_node(pxStack_10088,"Model",0,true);
  pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"BodySet",0,true);
  if ((pxVar9 == (xml_node<char> *)0x0) &&
     (pxVar10 = rapidxml::xml_node<char>::first_node((xml_node<char> *)0x0,"objects",0,true),
     pxVar10 != (xml_node<char> *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No body set detected for this model.",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  else {
    pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true);
    for (pxVar9 = pxVar9->m_first_node; pxVar9 != (xml_node<char> *)0x0;
        pxVar9 = pxVar9->m_next_sibling) {
      parseBody(this,pxVar9,system);
      if ((pxVar9->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) goto LAB_0092c5be;
    }
    pCStack_101a8 = (ChLoadContainer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLoadContainer,std::allocator<chrono::ChLoadContainer>>
              (&_Stack_101a0,&pCStack_101a8,(allocator<chrono::ChLoadContainer> *)&sStack_10100);
    sStack_10118.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &pCStack_101a8->super_ChPhysicsItem;
    sStack_10118.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_101a0._M_pi;
    if (_Stack_101a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_101a0._M_pi)->_M_use_count = (_Stack_101a0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_101a0._M_pi)->_M_use_count = (_Stack_101a0._M_pi)->_M_use_count + 1;
      }
    }
    ChSystem::Add(system,&sStack_10118);
    if (sStack_10118.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_10118.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pxVar9 = rapidxml::xml_node<char>::first_node(pxStack_10088,"Model",0,true);
    pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"ForceSet",0,true);
    if ((pxVar9 == (xml_node<char> *)0x0) ||
       (pxVar10 = rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true),
       pxVar10 == (xml_node<char> *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No forces detected.",0x13);
      cVar6 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      pcVar14 = (char *)(ulong)(uint)(int)cVar6;
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    else {
      poVar11 = std::ostream::_M_insert<void_const*>(&std::cout);
      rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true);
      poVar11 = std::ostream::_M_insert<void_const*>(poVar11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar14 = "objects";
      pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true);
      pxVar9 = pxVar9->m_first_node;
      if (pxVar9 != (xml_node<char> *)0x0) {
        do {
          sStack_10128.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = pCStack_101a8;
          sStack_10128.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_101a0._M_pi;
          if (_Stack_101a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_101a0._M_pi)->_M_use_count = (_Stack_101a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_101a0._M_pi)->_M_use_count = (_Stack_101a0._M_pi)->_M_use_count + 1;
            }
          }
          pcVar14 = (char *)pxVar9;
          parseForce(this,pxVar9,system,&sStack_10128);
          if (sStack_10128.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (sStack_10128.
                       super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((pxVar9->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
LAB_0092c5be:
            __assert_fail("this->m_parent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/rapidxml/rapidxml.hpp"
                          ,0x3ee,
                          "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                         );
          }
          pxVar9 = pxVar9->m_next_sibling;
        } while (pxVar9 != (xml_node<char> *)0x0);
      }
    }
    initShapes(this,(xml_node<char> *)pcVar14,system);
    if (_Stack_101a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_101a0._M_pi);
    }
  }
  if ((double *)auStack_10198._16_8_ != (double *)0x0) {
    operator_delete((void *)auStack_10198._16_8_,auStack_10180._8_8_ - auStack_10198._16_8_);
  }
  rapidxml::memory_pool<char>::clear(&mStack_10058);
  if ((pointer *)
      fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fStack_10168.m_data.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pStack_100e0.m_path);
  return;
}

Assistant:

void ChParserOpenSim::Parse(ChSystem& system, const std::string& filename) {
    // Use the model name as the directory for obj files. For example,
    // the osim file opensim/Rajagopal2015.osim should have the referenced obj
    // files sitting in data/opensim/Rajagopal2015/
    // Use filesystem for path parsing, we should probably use the library more
    path filepath(filename);
    // Set the member path so when we load meshes we can find them
    // Strip the parent and stem to use as directory for data files
    m_datapath = filepath.parent_path().str() + "/" + filepath.stem() + "/";

    rapidxml::file<char> file(filename.c_str());

    xml_document<> doc;
    doc.parse<0>(file.data());

    // Get gravity from model and set it in system
    auto elems = strToSTLVector<double>(doc.first_node()->first_node("Model")->first_node("gravity")->value());
    system.Set_G_acc(ChVector<>(elems[0], elems[1], elems[2]));

    // Traverse the list of bodies and parse the information for each one
    xml_node<>* bodySet = doc.first_node()->first_node("Model")->first_node("BodySet");
    if (bodySet == NULL && bodySet->first_node("objects") != NULL) {
        std::cout << "No body set detected for this model." << std::endl;
        return;
    }
    xml_node<>* bodyNode = bodySet->first_node("objects")->first_node();
    while (bodyNode != NULL) {
        parseBody(bodyNode, system);
        bodyNode = bodyNode->next_sibling();
    }

    ////xml_node<>* controllerSet =
    ////    doc.first_node()->first_node("Model")->first_node("ControllerSet")->first_node("objects");
    ////xml_node<>* controllerNode = controllerSet->first_node();
    ////while (controllerNode != NULL) {
    ////    auto actuators = strToSTLVector<std::string>(controllerNode->first_node("actuator_list")->value());
    ////    controllerNode = controllerNode->next_sibling();
    ////    // Read function as controllerNode->first_node("FunctionSet")
    ////}

    auto loadcontainer = chrono_types::make_shared<ChLoadContainer>();
    system.Add(loadcontainer);

    xml_node<>* forceSet = doc.first_node()->first_node("Model")->first_node("ForceSet");
    if (forceSet != NULL && forceSet->first_node("objects") != NULL) {
        std::cout << forceSet << forceSet->first_node("objects") << std::endl;
        xml_node<>* forceNode = forceSet->first_node("objects")->first_node();
        while (forceNode != NULL) {
            parseForce(forceNode, system, loadcontainer);
            forceNode = forceNode->next_sibling();
        }
    } else {
        std::cout << "No forces detected." << std::endl;
    }

    initShapes(bodyNode, system);
}